

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UChar32 utext_previous32From_63(UText *ut,int64_t index)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  UChar32 UVar4;
  long lVar5;
  
  lVar5 = index - ut->chunkNativeStart;
  if ((lVar5 != 0 && ut->chunkNativeStart <= index) && (index <= ut->chunkNativeLimit)) {
    if (lVar5 <= ut->nativeIndexingLimit) {
      ut->chunkOffset = (int32_t)lVar5;
      goto LAB_002de0e6;
    }
    iVar3 = (*ut->pFuncs->mapNativeIndexToUTF16)(ut,index);
    ut->chunkOffset = iVar3;
    if (iVar3 != 0) goto LAB_002de0e6;
  }
  UVar2 = (*ut->pFuncs->access)(ut,index,'\0');
  if (UVar2 == '\0') {
    return -1;
  }
LAB_002de0e6:
  iVar1 = ut->chunkOffset;
  ut->chunkOffset = iVar1 + -1;
  if ((ut->chunkContents[(long)iVar1 + -1] & 0xf800U) != 0xd800) {
    return (uint)(ushort)ut->chunkContents[(long)iVar1 + -1];
  }
  utext_setNativeIndex_63(ut,index);
  UVar4 = utext_previous32_63(ut);
  return UVar4;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_previous32From(UText *ut, int64_t index) {
    //
    //  Return the character preceding the specified index.
    //  Leave the iteration position at the start of the character that was returned.
    //
    UChar32     cPrev;    // The character preceding cCurr, which is what we will return.

    // Address the chunk containg the position preceding the incoming index
    // A tricky edge case:
    //   We try to test the requested native index against the chunkNativeStart to determine
    //    whether the character preceding the one at the index is in the current chunk.
    //    BUT, this test can fail with UTF-8 (or any other multibyte encoding), when the
    //    requested index is on something other than the first position of the first char.
    //
    if(index<=ut->chunkNativeStart || index>ut->chunkNativeLimit) {
        // Requested native index is outside of the current chunk.
        if(!ut->pFuncs->access(ut, index, FALSE)) {
            // no chunk available here
            return U_SENTINEL;
        }
    } else if(index - ut->chunkNativeStart <= (int64_t)ut->nativeIndexingLimit) {
        // Direct UTF-16 indexing.
        ut->chunkOffset = (int32_t)(index - ut->chunkNativeStart);
    } else {
        ut->chunkOffset=ut->pFuncs->mapNativeIndexToUTF16(ut, index);
        if (ut->chunkOffset==0 && !ut->pFuncs->access(ut, index, FALSE)) {
            // no chunk available here
            return U_SENTINEL;
        }
    }

    //
    // Simple case with no surrogates.
    //
    ut->chunkOffset--;
    cPrev = ut->chunkContents[ut->chunkOffset];

    if (U16_IS_SURROGATE(cPrev)) {
        // Possible supplementary.  Many edge cases.
        // Let other functions do the heavy lifting.
        utext_setNativeIndex(ut, index);
        cPrev = utext_previous32(ut);
    }
    return cPrev;
}